

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dreadtriple.c
# Opt level: O0

void dreadtriple(int *m,int *n,int_t *nonz,double **nzval,int_t **rowind,int_t **colptr)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  int_t *piVar4;
  int_t *piVar5;
  bool bVar6;
  void *addr;
  int *addr_00;
  int *addr_01;
  int zero_base;
  int *col;
  int *row;
  int_t *xa;
  int_t *asub;
  double *val;
  double *a;
  int local_48;
  int nz;
  int nnz;
  int jsize;
  int k;
  int j;
  int_t **colptr_local;
  int_t **rowind_local;
  double **nzval_local;
  int_t *nonz_local;
  int *n_local;
  int *m_local;
  
  bVar6 = false;
  __isoc99_scanf("%d%d",n,nonz);
  *m = *n;
  printf("m %d, n %d, nonz %ld\n",(ulong)(uint)*m,(ulong)(uint)*n,(long)*nonz);
  dallocateA(*n,*nonz,nzval,rowind,colptr);
  pdVar3 = *nzval;
  piVar4 = *rowind;
  piVar5 = *colptr;
  addr = superlu_malloc((long)*nonz << 3);
  addr_00 = int32Malloc(*nonz);
  addr_01 = int32Malloc(*nonz);
  for (jsize = 0; jsize < *n; jsize = jsize + 1) {
    piVar5[jsize] = 0;
  }
  local_48 = 0;
  a._4_4_ = 0;
  while( true ) {
    if (*nonz <= local_48) {
      *nonz = a._4_4_;
      nnz = 0;
      nz = *piVar5;
      *piVar5 = 0;
      for (jsize = 1; jsize < *n; jsize = jsize + 1) {
        nnz = nz + nnz;
        nz = piVar5[jsize];
        piVar5[jsize] = nnz;
      }
      for (a._4_4_ = 0; (int)a._4_4_ < *nonz; a._4_4_ = a._4_4_ + 1) {
        iVar1 = addr_01[(int)a._4_4_];
        iVar2 = piVar5[iVar1];
        piVar4[iVar2] = addr_00[(int)a._4_4_];
        pdVar3[iVar2] = *(double *)((long)addr + (long)(int)a._4_4_ * 8);
        piVar5[iVar1] = piVar5[iVar1] + 1;
      }
      for (jsize = *n; 0 < jsize; jsize = jsize + -1) {
        piVar5[jsize] = piVar5[jsize + -1];
      }
      *piVar5 = 0;
      superlu_free(addr);
      superlu_free(addr_00);
      superlu_free(addr_01);
      return;
    }
    __isoc99_scanf("%d%d%lf\n",addr_00 + (int)a._4_4_,addr_01 + (int)a._4_4_,
                   (void *)((long)addr + (long)(int)a._4_4_ * 8));
    if (local_48 == 0) {
      if ((*addr_00 == 0) || (*addr_01 == 0)) {
        bVar6 = true;
        printf("triplet file: row/col indices are zero-based.\n");
      }
      else {
        printf("triplet file: row/col indices are one-based.\n");
      }
    }
    if (!bVar6) {
      addr_00[(int)a._4_4_] = addr_00[(int)a._4_4_] + -1;
      addr_01[(int)a._4_4_] = addr_01[(int)a._4_4_] + -1;
    }
    if ((((addr_00[(int)a._4_4_] < 0) || (*m <= addr_00[(int)a._4_4_])) ||
        (addr_01[(int)a._4_4_] < 0)) || (*n <= addr_01[(int)a._4_4_])) break;
    piVar5[addr_01[(int)a._4_4_]] = piVar5[addr_01[(int)a._4_4_]] + 1;
    a._4_4_ = a._4_4_ + 1;
    local_48 = local_48 + 1;
  }
  fprintf(_stderr,"nz %d, (%d, %d) = %e out of bound, removed\n",
          *(undefined8 *)((long)addr + (long)(int)a._4_4_ * 8),(ulong)a._4_4_,
          (ulong)(uint)addr_00[(int)a._4_4_],(ulong)(uint)addr_01[(int)a._4_4_]);
  exit(-1);
}

Assistant:

void
dreadtriple(int *m, int *n, int_t *nonz,
	    double **nzval, int_t **rowind, int_t **colptr)
{
/*
 * Output parameters
 * =================
 *   (a,asub,xa): asub[*] contains the row subscripts of nonzeros
 *	in columns of matrix A; a[*] the numerical values;
 *	row i of A is given by a[k],k=xa[i],...,xa[i+1]-1.
 *
 */
    int    j, k, jsize, nnz, nz;
    double *a, *val;
    int_t  *asub, *xa;
    int    *row, *col;
    int    zero_base = 0;

    /*  Matrix format:
     *    First line:  #rows, #cols, #non-zero
     *    Triplet in the rest of lines:
     *                 row, col, value
     */

#ifdef _LONGINT
    scanf("%d%lld", n, nonz);
#else
    scanf("%d%d", n, nonz);
#endif    
    *m = *n;
    printf("m %d, n %d, nonz %ld\n", *m, *n, (long) *nonz);
    dallocateA(*n, *nonz, nzval, rowind, colptr); /* Allocate storage */
    a    = *nzval;
    asub = *rowind;
    xa   = *colptr;

    val = (double *) SUPERLU_MALLOC(*nonz * sizeof(double));
    row = int32Malloc(*nonz);
    col = int32Malloc(*nonz);

    for (j = 0; j < *n; ++j) xa[j] = 0;

    /* Read into the triplet array from a file */
    for (nnz = 0, nz = 0; nnz < *nonz; ++nnz) {
    
	scanf("%d%d%lf\n", &row[nz], &col[nz], &val[nz]);

        if ( nnz == 0 ) { /* first nonzero */
	    if ( row[0] == 0 || col[0] == 0 ) {
		zero_base = 1;
		printf("triplet file: row/col indices are zero-based.\n");
	    } else
		printf("triplet file: row/col indices are one-based.\n");
        }

        if ( !zero_base ) { 
 	  /* Change to 0-based indexing. */
	  --row[nz];
	  --col[nz];
        }

	if (row[nz] < 0 || row[nz] >= *m || col[nz] < 0 || col[nz] >= *n
	    /*|| val[nz] == 0.*/) {
	    fprintf(stderr, "nz %d, (%d, %d) = %e out of bound, removed\n",
		    nz, row[nz], col[nz], val[nz]);
	    exit(-1);
	} else {
	    ++xa[col[nz]];
	    ++nz;
	}
    }

    *nonz = nz;

    /* Initialize the array of column pointers */
    k = 0;
    jsize = xa[0];
    xa[0] = 0;
    for (j = 1; j < *n; ++j) {
	k += jsize;
	jsize = xa[j];
	xa[j] = k;
    }
    
    /* Copy the triplets into the column oriented storage */
    for (nz = 0; nz < *nonz; ++nz) {
	j = col[nz];
	k = xa[j];
	asub[k] = row[nz];
	a[k] = val[nz];
	++xa[j];
    }

    /* Reset the column pointers to the beginning of each column */
    for (j = *n; j > 0; --j)
	xa[j] = xa[j-1];
    xa[0] = 0;

    SUPERLU_FREE(val);
    SUPERLU_FREE(row);
    SUPERLU_FREE(col);

#ifdef CHK_INPUT
    {
	int i;
	for (i = 0; i < *n; i++) {
	    printf("Col %d, xa %d\n", i, xa[i]);
	    for (k = xa[i]; k < xa[i+1]; k++)
		printf("%d\t%16.10f\n", asub[k], a[k]);
	}
    }
#endif

}